

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

double __thiscall sophia_interface::ULMASS(sophia_interface *this,int KF)

{
  int iVar1;
  sophia_interface *psVar2;
  uint uVar3;
  uint uVar4;
  sophia_interface *this_00;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  uVar8 = -KF;
  if (0 < KF) {
    uVar8 = KF;
  }
  iVar1 = LUCOMP(this,KF);
  if (iVar1 == 0) {
    return 0.0;
  }
  PARF[0x69] = PMAS[0][5];
  PARF[0x6a] = PMAS[0][6];
  PARF[0x6b] = PMAS[0][7];
  bVar9 = MSTJ[0x5c] - 1U < 2;
  this_00 = (sophia_interface *)CONCAT71((int7)((ulong)this >> 8),uVar8 < 0xb && bVar9);
  if (uVar8 < 0xb && bVar9) {
    dVar14 = PARF[(ulong)uVar8 + 99];
    if (MSTJ[0x5c] != 2) goto LAB_0012b240;
    dVar14 = dVar14 - PARF[0x78];
LAB_0012aec3:
    if (dVar14 <= 0.0) {
      dVar14 = 0.0;
    }
  }
  else {
    uVar3 = iVar1 - 0x65;
    this_00 = (sophia_interface *)(ulong)CONCAT31((int3)(uVar3 >> 8),0xffffffeb < uVar3);
    if (uVar8 < 0x65 || 0xffffffeb >= uVar3) {
      dVar14 = *(double *)(KCHG[2] + (long)iVar1 * 2 + 0x1f2);
      goto LAB_0012b240;
    }
    uVar4 = uVar8 / 1000 + (uVar8 / 10000) * -10;
    this_00 = (sophia_interface *)(ulong)uVar4;
    uVar5 = uVar8 / 100 + (uVar8 / 1000) * -10;
    uVar6 = uVar8 / 10 + (uVar8 / 100) * -10;
    uVar3 = uVar8 + (uVar8 / 10 + uVar8 / 10) * -5;
    iVar7 = uVar8 / 10000 + (uVar8 / 100000) * -10;
    dVar12 = *(double *)((long)PARF + (ulong)(uVar5 * 8) + 0x318);
    dVar10 = *(double *)((long)PARF + (ulong)(uVar6 * 8) + 0x318);
    if (uVar3 < 4 && (uVar4 == 0 && iVar7 == 0)) {
      if (uVar3 == 1) {
        dVar11 = -3.0 / (dVar12 * dVar10);
      }
      else {
        dVar11 = 0.0;
      }
      dVar13 = PARF[0x70];
      dVar14 = PARF[0x6e];
      if (2 < uVar3) {
        dVar11 = 1.0 / (dVar12 * dVar10);
      }
    }
    else {
      if (uVar4 == 0) {
        this_00 = (sophia_interface *)0x74;
        if (iVar7 != 2) {
          this_00 = (sophia_interface *)(ulong)(uVar3 == 1 | 0x72);
        }
        psVar2 = (sophia_interface *)0x75;
        if (uVar3 != 5) {
          psVar2 = this_00;
        }
        dVar14 = dVar10 + dVar12 + PARF[(long)psVar2];
        goto LAB_0012b240;
      }
      dVar14 = *(double *)((long)PARF + (ulong)(uVar4 * 8) + 0x318);
      if (uVar6 == 0) {
        if (uVar3 == 1) {
          dVar10 = -3.0 / (dVar14 * dVar12);
        }
        else {
          dVar10 = 0.0;
        }
        if (uVar3 == 3) {
          dVar10 = 1.0 / (dVar14 * dVar12);
        }
        dVar11 = (PARF[0x6f] + PARF[0x6f]) / 3.0;
        if (MSTJ[0x5c] != 1) {
          dVar12 = dVar12 + dVar14 + dVar11;
          dVar14 = PARF[0x71] * PARF[100] * PARF[100] * dVar10;
        }
        dVar14 = dVar14 + dVar12;
        if (MSTJ[0x5c] != 2) goto LAB_0012b240;
        dVar14 = (dVar14 - PARF[0x79]) - dVar11;
        goto LAB_0012aec3;
      }
      uVar4 = uVar4 ^ uVar5 | uVar3 ^ 2;
      this_00 = (sophia_interface *)(ulong)uVar4;
      if (uVar4 == 0) {
        dVar11 = (1.0 / (dVar14 * dVar12) - 2.0 / (dVar14 * dVar10)) - 2.0 / (dVar12 * dVar10);
      }
      else {
        bVar9 = uVar5 < uVar6 || uVar3 != 2;
        this_00 = (sophia_interface *)(ulong)CONCAT31((int3)(uVar4 >> 8),bVar9);
        if (bVar9) {
          if (uVar3 == 2) {
            dVar11 = -3.0 / (dVar12 * dVar10);
          }
          else {
            dVar11 = 1.0 / (dVar12 * dVar10) + 1.0 / (dVar14 * dVar10) + 1.0 / (dVar14 * dVar12);
          }
        }
        else {
          dVar11 = 1.0 / (dVar12 * dVar10) + -2.0 / (dVar14 * dVar10) + -2.0 / (dVar14 * dVar12);
        }
      }
      dVar13 = PARF[0x71];
      dVar14 = dVar14 + PARF[0x6f];
    }
    dVar14 = dVar13 * PARF[100] * PARF[100] * dVar11 + dVar10 + dVar12 + dVar14;
  }
LAB_0012b240:
  if (0 < MSTJ[0x17]) {
    dVar12 = PMAS[0][(long)iVar1 + 499];
    if (0.0001 < dVar12) {
      if ((MSTJ[0x17] == 1) || (100 < uVar8 && MSTJ[0x17] == 2)) {
        dVar10 = RLU(this_00,false);
        dVar11 = atan((PMAS[1][(long)iVar1 + 499] + PMAS[1][(long)iVar1 + 499]) /
                      PMAS[0][(long)iVar1 + 499]);
        dVar10 = tan(dVar11 * (dVar10 + dVar10 + -1.0));
        dVar14 = dVar14 + dVar10 * dVar12 * 0.5;
      }
      else {
        dVar12 = dVar14 - PMAS[1][(long)iVar1 + 499];
        if (dVar12 <= 0.0) {
          dVar12 = 0.0;
        }
        dVar10 = atan((dVar12 * dVar12 + -dVar14 * dVar14) / (PMAS[0][(long)iVar1 + 499] * dVar14));
        dVar12 = PMAS[1][(long)iVar1 + 499] + dVar14;
        dVar11 = atan((dVar12 * dVar12 + -dVar14 * dVar14) / (PMAS[0][(long)iVar1 + 499] * dVar14));
        dVar12 = PMAS[0][(long)iVar1 + 499];
        dVar13 = RLU(this_00,false);
        dVar10 = tan(dVar13 * (dVar11 - dVar10) + dVar10);
        dVar14 = dVar14 * dVar14 + dVar10 * dVar12 * dVar14;
        if (dVar14 <= 0.0) {
          dVar14 = 0.0;
        }
        if (dVar14 < 0.0) {
          dVar14 = sqrt(dVar14);
        }
        else {
          dVar14 = SQRT(dVar14);
        }
      }
    }
  }
  MSTJ[0x5c] = 0;
  return dVar14;
}

Assistant:

double sophia_interface::ULMASS(int KF) {
// Purpose: to give the mass of a particle/parton.
    double result = 0.;
    int KFA = std::abs(KF);
    int KC = LUCOMP(KF);
    if (KC == 0) return 0;
    PARF[105] = PMAS[0][5];
    PARF[106] = PMAS[0][6];
    PARF[107] = PMAS[0][7];

    // Guarantee use of constituent masses for internal checks.
    if ((MSTJ[92] == 1 || MSTJ[92] == 2) && KFA <= 10) {
        result = PARF[99 + KFA];
        if (MSTJ[92] == 2) result = std::max(0., result - PARF[120]);

    // Masses that can be read directly off table.
    } else if (KFA <= 100 || KC <= 80 || KC > 100) {
        result = PMAS[0][KC - 1];

    // Find constituent partons and their masses.
    } else {
        int KFLA = (KFA / 1000) % 10;
        int KFLB = (KFA / 100) % 10;
        int KFLC = (KFA / 10) % 10;
        int KFLS = KFA % 10;
        int KFLR = (KFA / 10000) % 10;
        double PMA = PARF[99 + KFLA];
        double PMB = PARF[99 + KFLB];
        double PMC = PARF[99 + KFLC];
        double PMSPL = 0.;

        // Construct masses for various meson, diquark and baryon cases.
        if (KFLA == 0 && KFLR == 0 && KFLS <= 3) {
            if (KFLS == 1) PMSPL = -3. / (PMB * PMC);
            if (KFLS >= 3) PMSPL = 1. / (PMB * PMC);
            result = PARF[110] + PMB + PMC + PARF[112] * PARF[100] * PARF[100] * PMSPL;
        } else if (KFLA == 0) {
            int KMUL = 2;
            if (KFLS == 1) KMUL = 3;
            if (KFLR == 2) KMUL = 4;
            if (KFLS == 5) KMUL = 5;
            result = PARF[112 + KMUL] + PMB + PMC;
        } else if (KFLC == 0) {
            if (KFLS == 1) PMSPL = -3. / (PMA * PMB);
            if (KFLS == 3) PMSPL = 1. / (PMA * PMB);
            result = 2. * PARF[111] / 3. + PMA + PMB + PARF[113] * PARF[100] * PARF[100] * PMSPL; 
            if (MSTJ[92] == 1) result = PMA + PMB;
            if (MSTJ[92] == 2) result = std::max(0., result - PARF[121] - 2. * PARF[111] / 3.);
      } else {
            if (KFLS == 2 && KFLA == KFLB) {
                PMSPL = 1. / (PMA * PMB) - 2. / (PMA * PMC) - 2. / (PMB * PMC);
            } else if (KFLS == 2 && KFLB >= KFLC) {
                PMSPL = -2. / (PMA * PMB) - 2. / (PMA * PMC) + 1. / (PMB * PMC);
            } else if (KFLS == 2) {
                PMSPL = -3. / (PMB * PMC);
            } else {
                PMSPL = 1. / (PMA * PMB) + 1. / (PMA * PMC) + 1. / (PMB * PMC);
            }
            result = PARF[111] + PMA + PMB + PMC + PARF[113] * PARF[100] * PARF[100] * PMSPL;
        }
    }

    // Optional mass broadening according to truncated Breit-Wigner (either in m or in m^2).
    if (MSTJ[23] >= 1 && PMAS[1][KC - 1] > 1e-4) {
        if (MSTJ[23] == 1 || (MSTJ[23] == 2 && KFA > 100)) {
            result += 0.5 * PMAS[1][KC - 1] * std::tan((2. * RLU() - 1.) * std::atan(2. * PMAS[2][KC - 1] / PMAS[1][KC - 1]));
        } else {
            double PM0 = result;
            double PMLOW = std::atan((std::pow(std::max(0., PM0 - PMAS[2][KC - 1]), 2) - PM0 * PM0) / (PM0 * PMAS[1][KC - 1]));
            double PMUPP = std::atan((std::pow((PM0 + PMAS[2][KC - 1]), 2) - PM0* PM0) / (PM0 * PMAS[1][KC - 1]));
            result = std::sqrt(std::max(0., PM0 * PM0 + PM0 * PMAS[1][KC - 1] * std::tan(PMLOW + (PMUPP - PMLOW) * RLU())));
        }
    }
    MSTJ[92] = 0;
    return result;
}